

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O2

int mbedtls_asn1_write_algorithm_identifier_ext
              (uchar **p,uchar *start,char *oid,size_t oid_len,size_t par_len,int has_par)

{
  uint uVar1;
  int iVar2;
  
  if (has_par == 0) {
    par_len = 0;
  }
  else if (par_len == 0) {
    uVar1 = mbedtls_asn1_write_null(p,start);
    if ((int)uVar1 < 0) {
      return uVar1;
    }
    par_len = (size_t)uVar1;
  }
  uVar1 = mbedtls_asn1_write_oid(p,start,oid,oid_len);
  if ((int)uVar1 < 0) {
    return uVar1;
  }
  iVar2 = mbedtls_asn1_write_len_and_tag(p,start,par_len + uVar1,'0');
  return iVar2;
}

Assistant:

int mbedtls_asn1_write_algorithm_identifier_ext(unsigned char **p, const unsigned char *start,
                                                const char *oid, size_t oid_len,
                                                size_t par_len, int has_par)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    if (has_par) {
        if (par_len == 0) {
            MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_null(p, start));
        } else {
            len += par_len;
        }
    }

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_oid(p, start, oid, oid_len));

    return mbedtls_asn1_write_len_and_tag(p, start, len,
                                          MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE);
}